

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void clear_datagram_frame_payloads(quicly_conn_t *conn)

{
  undefined8 *puVar1;
  long in_RDI;
  ptls_iovec_t pVar2;
  size_t i;
  uint8_t *local_20;
  size_t local_18;
  long local_10;
  
  for (local_10 = 0; local_10 != *(long *)(in_RDI + 0x8a8); local_10 = local_10 + 1) {
    free(*(void **)(in_RDI + 0x808 + local_10 * 0x10));
    puVar1 = (undefined8 *)(in_RDI + 0x808 + local_10 * 0x10);
    pVar2 = ptls_iovec_init((void *)0x0,0);
    local_20 = pVar2.base;
    *puVar1 = local_20;
    local_18 = pVar2.len;
    puVar1[1] = local_18;
  }
  *(undefined8 *)(in_RDI + 0x8a8) = 0;
  return;
}

Assistant:

static void clear_datagram_frame_payloads(quicly_conn_t *conn)
{
    for (size_t i = 0; i != conn->egress.datagram_frame_payloads.count; ++i) {
        free(conn->egress.datagram_frame_payloads.payloads[i].base);
        conn->egress.datagram_frame_payloads.payloads[i] = ptls_iovec_init(NULL, 0);
    }
    conn->egress.datagram_frame_payloads.count = 0;
}